

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool trans_WFI(DisasContext_conflict1 *s,arg_WFI *a)

{
  _Bool extraout_AL;
  
  gen_set_pc_im(s,(s->base).pc_next);
  (s->base).is_jmp = DISAS_TARGET_2;
  return extraout_AL;
}

Assistant:

static bool trans_WFI(DisasContext *s, arg_WFI *a)
{
    /* For WFI, halt the vCPU until an IRQ. */
    gen_set_pc_im(s, s->base.pc_next);
    s->base.is_jmp = DISAS_WFI;
    return true;
}